

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O1

Uint64 efsw::Platform::System::getMaxFD(void)

{
  rlimit limit;
  rlimit local_18;
  
  if (getMaxFD::max_fd == 0) {
    getrlimit(RLIMIT_NOFILE,&local_18);
    getMaxFD::max_fd = local_18.rlim_cur;
  }
  return getMaxFD::max_fd;
}

Assistant:

Uint64 System::getMaxFD() {
	static rlim_t max_fd = 0;

	if ( max_fd == 0 ) {
		struct rlimit limit;
		getrlimit( RLIMIT_NOFILE, &limit );
		max_fd = limit.rlim_cur;
	}

	return max_fd;
}